

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_TestShell::
~TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_TestShell
          (TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCheckedActualCall, remainderOfMockActualCallTraceWorksAsItShould)
{
    int value;
    const int const_value = 1;
    const unsigned char mem_buffer[] = { 0xFE, 0x15 };
    void (*function_value)() = (void (*)())0xDEAD;
    MockActualCallTrace actual;
    actual.withName("func");
    actual.withCallOrder(1);
    actual.onObject(&value);

    actual.withBoolParameter("bool", true);
    actual.withUnsignedIntParameter("unsigned_int", (unsigned int) 1);
    actual.withUnsignedLongIntParameter("unsigned_long", (unsigned long)1);
    actual.withLongIntParameter("long_int", (long int) 1);
#if CPPUTEST_USE_LONG_LONG
    actual.withLongLongIntParameter("long_long_int", (long long int) 1);
    actual.withUnsignedLongLongIntParameter("unsigned_long_long_int", (unsigned long long int) 1);
#endif
    actual.withPointerParameter("pointer", &value);
    actual.withConstPointerParameter("const_pointer", &const_value);
    actual.withFunctionPointerParameter("function_pointer", function_value);
    actual.withMemoryBufferParameter("mem_buffer", mem_buffer, sizeof(mem_buffer));
    actual.withParameterOfType("int", "named_type", &const_value);

    SimpleString expectedString("\nFunction name:func");
    expectedString += " withCallOrder:1";
    expectedString += " onObject:0x";
    expectedString += HexStringFrom(&value);
    expectedString += " bool:true";
    expectedString += " unsigned_int:1 (0x1)";
    expectedString += " unsigned_long:1 (0x1)";
    expectedString += " long_int:1 (0x1)";
#if CPPUTEST_USE_LONG_LONG
    expectedString += " long_long_int:1 (0x1)";
    expectedString += " unsigned_long_long_int:1 (0x1)";
#endif
    expectedString += " pointer:0x";
    expectedString += HexStringFrom(&value);
    expectedString += " const_pointer:0x";
    expectedString += HexStringFrom(&const_value);
    expectedString += " function_pointer:0x";
    expectedString += HexStringFrom(function_value);
    expectedString += " mem_buffer:Size = 2 | HexContents = FE 15";
    expectedString += " int named_type:0x";
    expectedString += HexStringFrom(&const_value);
    STRCMP_EQUAL(expectedString.asCharString(), actual.getTraceOutput());

    CHECK_FALSE(actual.hasReturnValue());
    CHECK(actual.returnValue().equals(MockNamedValue("")));
    CHECK(false == actual.returnBoolValue());
    CHECK(false == actual.returnBoolValueOrDefault(true));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(0 == actual.returnUnsignedLongIntValue());
    CHECK(0 == actual.returnIntValue());
    CHECK(0 == actual.returnUnsignedLongIntValueOrDefault(1ul));
    CHECK(0 == actual.returnIntValueOrDefault(1));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(0 == actual.returnLongIntValueOrDefault(1l));
#if CPPUTEST_USE_LONG_LONG
    CHECK(0 == actual.returnLongLongIntValue());
    CHECK(0 == actual.returnLongLongIntValueOrDefault(1ll));
    CHECK(0 == actual.returnUnsignedLongLongIntValue());
    CHECK(0 == actual.returnUnsignedLongLongIntValueOrDefault(1ull));
#endif
    CHECK(0 == actual.returnUnsignedIntValue());
    CHECK(0 == actual.returnUnsignedIntValueOrDefault(1u));
    DOUBLES_EQUAL(0.0, actual.returnDoubleValue(), 0.0);
    DOUBLES_EQUAL(0.0, actual.returnDoubleValueOrDefault(1.0), 0.0);
    STRCMP_EQUAL("", actual.returnStringValueOrDefault("bla"));
    STRCMP_EQUAL("", actual.returnStringValue());
    CHECK(NULLPTR == actual.returnPointerValue());
    CHECK(NULLPTR == actual.returnPointerValueOrDefault((void*) NULLPTR));
    CHECK(NULLPTR == actual.returnConstPointerValue());
    CHECK(NULLPTR == actual.returnConstPointerValueOrDefault((const void*) NULLPTR));
    CHECK(NULLPTR == actual.returnFunctionPointerValue());
    CHECK(NULLPTR == actual.returnFunctionPointerValueOrDefault((void (*)()) NULLPTR));
}